

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log.cc
# Opt level: O2

bool __thiscall DepsLog::Recompact(DepsLog *this,string *path,string *err)

{
  pointer ppNVar1;
  pointer ppDVar2;
  Deps *pDVar3;
  pointer ppDVar4;
  pointer ppNVar5;
  pointer ppDVar6;
  Metrics *this_00;
  bool bVar7;
  int iVar8;
  pointer ppNVar9;
  int *piVar10;
  Metric *pMVar11;
  DepsLog *this_01;
  long lVar12;
  string temp_path;
  ScopedMetric metrics_h_scoped;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  ScopedMetric local_a0;
  undefined1 local_90 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  pointer local_60;
  pointer ppNStack_58;
  pointer local_50;
  pointer ppDStack_48;
  pointer local_40;
  pointer ppDStack_38;
  
  if (Recompact(std::__cxx11::string_const&,std::__cxx11::string*)::metrics_h_metric == '\0') {
    iVar8 = __cxa_guard_acquire(&Recompact(std::__cxx11::string_const&,std::__cxx11::string*)::
                                 metrics_h_metric);
    this_00 = g_metrics;
    if (iVar8 != 0) {
      if (g_metrics == (Metrics *)0x0) {
        pMVar11 = (Metric *)0x0;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_90,".ninja_deps recompact",(allocator<char> *)&local_c0);
        pMVar11 = Metrics::NewMetric(this_00,(string *)local_90);
        std::__cxx11::string::~string((string *)local_90);
      }
      Recompact::metrics_h_metric = pMVar11;
      __cxa_guard_release(&Recompact(std::__cxx11::string_const&,std::__cxx11::string*)::
                           metrics_h_metric);
    }
  }
  ScopedMetric::ScopedMetric(&local_a0,Recompact::metrics_h_metric);
  Close(this);
  std::operator+(&local_c0,path,".recompact");
  unlink(local_c0._M_dataplus._M_p);
  local_90._16_8_ = &local_70;
  local_90[0] = (string)0x0;
  local_90._8_8_ = (FILE *)0x0;
  local_90._24_8_ = 0;
  local_70._M_local_buf[0] = '\0';
  local_60 = (pointer)0x0;
  ppNStack_58 = (pointer)0x0;
  local_50 = (pointer)0x0;
  ppDStack_48 = (pointer)0x0;
  local_40 = (pointer)0x0;
  ppDStack_38 = (pointer)0x0;
  this_01 = (DepsLog *)local_90;
  bVar7 = OpenForWrite(this_01,&local_c0,err);
  if (bVar7) {
    ppNVar1 = (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppNVar9 = (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppNVar9 != ppNVar1; ppNVar9 = ppNVar9 + 1) {
      (*ppNVar9)->id_ = -1;
    }
    for (lVar12 = 0;
        ppDVar2 = (this->deps_).
                  super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
                  super__Vector_impl_data._M_start,
        lVar12 < (int)((ulong)((long)(this->deps_).
                                     super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar2) >>
                      3); lVar12 = lVar12 + 1) {
      pDVar3 = ppDVar2[lVar12];
      if (pDVar3 != (Deps *)0x0) {
        bVar7 = IsDepsEntryLiveFor(this_01,(this->nodes_).
                                           super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                           _M_impl.super__Vector_impl_data._M_start[lVar12]);
        if (bVar7) {
          this_01 = (DepsLog *)local_90;
          bVar7 = RecordDeps((DepsLog *)local_90,
                             (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                             _M_impl.super__Vector_impl_data._M_start[lVar12],pDVar3->mtime,
                             pDVar3->node_count,pDVar3->nodes);
          if (!bVar7) {
            Close((DepsLog *)local_90);
            goto LAB_0010ebcc;
          }
        }
      }
    }
    Close((DepsLog *)local_90);
    ppDVar2 = (this->deps_).super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppDVar4 = (this->deps_).super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->deps_).super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_finish = local_40;
    (this->deps_).super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = ppDStack_38;
    ppNVar9 = (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppNVar1 = (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_start = local_60;
    (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppNStack_58;
    ppNVar5 = (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    ppDVar6 = (this->deps_).super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_50;
    (this->deps_).super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_start = ppDStack_48;
    local_60 = ppNVar9;
    ppNStack_58 = ppNVar1;
    local_50 = ppNVar5;
    ppDStack_48 = ppDVar6;
    local_40 = ppDVar2;
    ppDStack_38 = ppDVar4;
    iVar8 = unlink((path->_M_dataplus)._M_p);
    if (-1 < iVar8) {
      iVar8 = rename(local_c0._M_dataplus._M_p,(path->_M_dataplus)._M_p);
      bVar7 = true;
      if (-1 < iVar8) goto LAB_0010ebce;
    }
    piVar10 = __errno_location();
    strerror(*piVar10);
    std::__cxx11::string::assign((char *)err);
  }
LAB_0010ebcc:
  bVar7 = false;
LAB_0010ebce:
  ~DepsLog((DepsLog *)local_90);
  std::__cxx11::string::~string((string *)&local_c0);
  ScopedMetric::~ScopedMetric(&local_a0);
  return bVar7;
}

Assistant:

bool DepsLog::Recompact(const string& path, string* err) {
  METRIC_RECORD(".ninja_deps recompact");

  Close();
  string temp_path = path + ".recompact";

  // OpenForWrite() opens for append.  Make sure it's not appending to a
  // left-over file from a previous recompaction attempt that crashed somehow.
  unlink(temp_path.c_str());

  DepsLog new_log;
  if (!new_log.OpenForWrite(temp_path, err))
    return false;

  // Clear all known ids so that new ones can be reassigned.  The new indices
  // will refer to the ordering in new_log, not in the current log.
  for (vector<Node*>::iterator i = nodes_.begin(); i != nodes_.end(); ++i)
    (*i)->set_id(-1);

  // Write out all deps again.
  for (int old_id = 0; old_id < (int)deps_.size(); ++old_id) {
    Deps* deps = deps_[old_id];
    if (!deps) continue;  // If nodes_[old_id] is a leaf, it has no deps.

    if (!IsDepsEntryLiveFor(nodes_[old_id]))
      continue;

    if (!new_log.RecordDeps(nodes_[old_id], deps->mtime,
                            deps->node_count, deps->nodes)) {
      new_log.Close();
      return false;
    }
  }

  new_log.Close();

  // All nodes now have ids that refer to new_log, so steal its data.
  deps_.swap(new_log.deps_);
  nodes_.swap(new_log.nodes_);

  if (unlink(path.c_str()) < 0) {
    *err = strerror(errno);
    return false;
  }

  if (rename(temp_path.c_str(), path.c_str()) < 0) {
    *err = strerror(errno);
    return false;
  }

  return true;
}